

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# olc_art.hpp
# Opt level: O1

key_view __thiscall
unodb::
olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
::iterator::get_key(iterator *this)

{
  ulong uVar1;
  _Elt_pointer psVar2;
  key_view kVar3;
  
  if ((this->stack_).c.
      super__Deque_base<unodb::olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator::stack_entry,_std::allocator<unodb::olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator::stack_entry>_>
      ._M_impl.super__Deque_impl_data._M_finish._M_cur ==
      (this->stack_).c.
      super__Deque_base<unodb::olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator::stack_entry,_std::allocator<unodb::olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator::stack_entry>_>
      ._M_impl.super__Deque_impl_data._M_start._M_cur) {
    __assert_fail("valid()",
                  "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/./olc_art.hpp"
                  ,0xa4d,
                  "key_view unodb::olc_db<std::span<const std::byte>, std::span<const std::byte>>::iterator::get_key() [Key = std::span<const std::byte>, Value = std::span<const std::byte>]"
                 );
  }
  psVar2 = (this->stack_).c.
           super__Deque_base<unodb::olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator::stack_entry,_std::allocator<unodb::olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator::stack_entry>_>
           ._M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (psVar2 == (this->stack_).c.
                super__Deque_base<unodb::olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator::stack_entry,_std::allocator<unodb::olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator::stack_entry>_>
                ._M_impl.super__Deque_impl_data._M_finish._M_first) {
    psVar2 = (this->stack_).c.
             super__Deque_base<unodb::olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator::stack_entry,_std::allocator<unodb::olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator::stack_entry>_>
             ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x10;
  }
  uVar1 = psVar2[-1].super_iter_result.node.tagged_ptr;
  if ((uVar1 & 7) == 0) {
    kVar3._M_ptr = uVar1 + 0x20;
    kVar3._M_extent._M_extent_value._0_4_ = *(undefined4 *)(uVar1 + 0x18);
    kVar3._M_extent._M_extent_value._4_4_ = 0;
    return kVar3;
  }
  __assert_fail("node.type() == node_type::LEAF",
                "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/./olc_art.hpp"
                ,0xa5a,
                "key_view unodb::olc_db<std::span<const std::byte>, std::span<const std::byte>>::iterator::get_key() [Key = std::span<const std::byte>, Value = std::span<const std::byte>]"
               );
}

Assistant:

key_view olc_db<Key, Value>::iterator::get_key() noexcept {
  UNODB_DETAIL_ASSERT(valid());  // by contract
  // Note: If the iterator is on a leaf, we return the key for that
  // leaf regardless of whether the leaf has been deleted.  This is
  // part of the design semantics for the OLC ART scan.
  //
  // TODO(thompsonbry) : variable length keys. The simplest case
  // where this does not work today is a single root leaf.  In that
  // case, there is no inode path and we can not properly track the
  // key in the key_buffer.
  //
  // return keybuf_.get_key_view();
  const auto& e = stack_.top();
  const auto& node = e.node;
  UNODB_DETAIL_ASSERT(node.type() == node_type::LEAF);      // On a leaf.
  const auto* const leaf{node.template ptr<leaf_type*>()};  // current leaf.
  return leaf->get_key_view();
}